

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPHashAlgorithm.cpp
# Opt level: O0

bool __thiscall OSSLEVPHashAlgorithm::hashInit(OSSLEVPHashAlgorithm *this)

{
  EVP_MD_CTX *ctx;
  bool bVar1;
  int iVar2;
  _func_int **pp_Var3;
  undefined4 extraout_var;
  HashAlgorithm *in_RDI;
  ByteString dummy;
  ByteString local_38;
  byte local_1;
  
  bVar1 = HashAlgorithm::hashInit(in_RDI);
  if (bVar1) {
    pp_Var3 = (_func_int **)EVP_MD_CTX_new();
    in_RDI[1]._vptr_HashAlgorithm = pp_Var3;
    if (in_RDI[1]._vptr_HashAlgorithm == (_func_int **)0x0) {
      softHSMLog(3,"hashInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPHashAlgorithm.cpp"
                 ,0x37,"Failed to allocate space for EVP_MD_CTX");
      local_1 = 0;
    }
    else {
      ctx = (EVP_MD_CTX *)in_RDI[1]._vptr_HashAlgorithm;
      iVar2 = (*in_RDI->_vptr_HashAlgorithm[6])();
      iVar2 = EVP_DigestInit_ex(ctx,(EVP_MD *)CONCAT44(extraout_var,iVar2),(ENGINE *)0x0);
      if (iVar2 == 0) {
        softHSMLog(3,"hashInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPHashAlgorithm.cpp"
                   ,0x3f,"EVP_DigestInit failed");
        EVP_MD_CTX_free(in_RDI[1]._vptr_HashAlgorithm);
        in_RDI[1]._vptr_HashAlgorithm = (_func_int **)0x0;
        ByteString::ByteString((ByteString *)0x131b0c);
        HashAlgorithm::hashFinal(in_RDI,&local_38);
        local_1 = 0;
        ByteString::~ByteString((ByteString *)0x131b2c);
      }
      else {
        local_1 = 1;
      }
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPHashAlgorithm::hashInit()
{
	if (!HashAlgorithm::hashInit())
	{
		return false;
	}

	// Initialize the context
	curCTX = EVP_MD_CTX_new();
	if (curCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for EVP_MD_CTX");

		return false;
	}

	// Initialize EVP digesting
	if (!EVP_DigestInit_ex(curCTX, getEVPHash(), NULL))
	{
		ERROR_MSG("EVP_DigestInit failed");

		EVP_MD_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		HashAlgorithm::hashFinal(dummy);

		return false;
	}

	return true;
}